

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projector.h
# Opt level: O1

void __thiscall Projector::DisplayCurrentSlice(Projector *this)

{
  undefined8 *local_88;
  Mat *local_80;
  undefined8 auStack_78 [2];
  undefined8 local_68;
  _InputArray local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_88 = auStack_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Current Image","");
  cv::namedWindow((string *)&local_88,0);
  if (local_88 != auStack_78) {
    operator_delete(local_88);
  }
  auStack_78[0] = 0;
  local_88 = (undefined8 *)CONCAT44(local_88._4_4_,0x3010000);
  local_68 = 0x1e0000001e;
  local_48 = 0x406fe00000000000;
  uStack_40 = 0x406fe00000000000;
  local_38 = 0x406fe00000000000;
  uStack_30 = 0;
  local_80 = &this->CurrentImage;
  cv::putText(0,&local_88,&this->CurrentImageLoc,&local_68,5,&local_48,1,8,0);
  local_88 = auStack_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Current Image","");
  local_60.sz.width = 0;
  local_60.sz.height = 0;
  local_60.flags = 0x1010000;
  local_60.obj = &this->CurrentImage;
  cv::imshow((string *)&local_88,&local_60);
  if (local_88 != auStack_78) {
    operator_delete(local_88);
  }
  cv::waitKey(20000);
  return;
}

Assistant:

void Projector::DisplayCurrentSlice()
{
	//Displays the current image on an openCV window

	namedWindow("Current Image", WINDOW_NORMAL);
	cv::Point pt = Point(0,0);
	putText(CurrentImage, CurrentImageLoc, Point(30,30), FONT_HERSHEY_COMPLEX_SMALL, 2, Scalar(255, 255, 255), 1, 8, false);
	imshow("Current Image", CurrentImage);
	waitKey(20000);

}